

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summaryindex.cpp
# Opt level: O2

void summaryindex::indexevents
               (string *fullfilename,
               map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               *summaryfileperiod_to_offset,int file_id,
               map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
               *eventtoperiods)

{
  _Base_ptr p_Var1;
  int __status;
  FILE *__stream;
  size_t sVar2;
  size_t sVar3;
  const_iterator cVar4;
  mapped_type *this;
  long lVar5;
  _Base_ptr p_Var6;
  longlong offset;
  int local_6c;
  int summarycalcstream_type;
  summary_period k;
  undefined4 local_44;
  int samplesize;
  summarySampleslevelHeader sh;
  
  local_6c = file_id;
  __stream = fopen((fullfilename->_M_dataplus)._M_p,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"%s: cannot open %s\n","indexevents",(fullfilename->_M_dataplus)._M_p);
    __status = 1;
LAB_001074ec:
    exit(__status);
  }
  offset = 0;
  summarycalcstream_type = 0;
  lVar5 = 4;
  sVar2 = fread(&summarycalcstream_type,4,1,__stream);
  if (sVar2 != 0) {
    offset = 4;
    lVar5 = 8;
  }
  if ((summarycalcstream_type & 0x3000000U) != 0x3000000) {
    fprintf(_stderr,"%s: Not a summarycalc stream type %d\n","indexevents");
    __status = -1;
    goto LAB_001074ec;
  }
  sVar2 = fread(&samplesize,4,1,__stream);
  if (sVar2 != 0) {
    local_44 = 0;
    offset = lVar5;
    sVar2 = fread(&local_44,4,1,__stream);
    if (sVar2 != 0) {
      offset = lVar5 + 4;
      goto LAB_001073bc;
    }
  }
  sVar2 = 0;
LAB_001073bc:
  do {
    do {
      if (sVar2 == 0) {
        fclose(__stream);
        return;
      }
      sVar3 = fread(&sh,0xc,1,__stream);
      sVar2 = 0;
    } while (sVar3 == 0);
    cVar4 = std::
            _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
            ::find(&eventtoperiods->_M_t,&sh.event_id);
    if ((_Rb_tree_header *)cVar4._M_node != &(eventtoperiods->_M_t)._M_impl.super__Rb_tree_header) {
      k.summary_id = sh.summary_id;
      k.fileindex = local_6c;
      p_Var1 = cVar4._M_node[1]._M_left;
      for (p_Var6 = cVar4._M_node[1]._M_parent; p_Var6 != p_Var1;
          p_Var6 = (_Base_ptr)&p_Var6->field_0x4) {
        k.period_no = p_Var6->_M_color;
        this = std::
               map<summary_period,_std::vector<long_long,_std::allocator<long_long>_>,_std::less<summary_period>,_std::allocator<std::pair<const_summary_period,_std::vector<long_long,_std::allocator<long_long>_>_>_>_>
               ::operator[](summaryfileperiod_to_offset,&k);
        std::vector<long_long,_std::allocator<long_long>_>::push_back(this,&offset);
      }
    }
    offset = offset + 0xc;
    do {
      sVar2 = fread(&k,8,1,__stream);
      if (sVar2 == 0) break;
      offset = offset + 8;
    } while (k.summary_id != 0);
  } while( true );
}

Assistant:

void indexevents(const std::string& fullfilename, std::map<summary_period, std::vector<long long>> &summaryfileperiod_to_offset, int file_id, const std::map<int, std::vector<int>> &eventtoperiods) {
		FILE* fin = fopen(fullfilename.c_str(), "rb");
		if (fin == NULL) {
			fprintf(stderr, "%s: cannot open %s\n", __func__, fullfilename.c_str());
			exit(EXIT_FAILURE);
		}
		long long offset = 0;
		int summarycalcstream_type = 0;
		size_t i = fread(&summarycalcstream_type, sizeof(summarycalcstream_type), 1, fin);
		if (i != 0) offset += sizeof(summarycalcstream_type);
		int stream_type = summarycalcstream_type & summarycalc_id;

		if (stream_type != summarycalc_id) {
			fprintf(stderr, "%s: Not a summarycalc stream type %d\n", __func__, stream_type);
			exit(-1);
		}

		stream_type = streamno_mask & summarycalcstream_type;
		int samplesize;
		i = fread(&samplesize, sizeof(samplesize), 1, fin);
		if (i != 0) offset += sizeof(samplesize);
		int summary_set = 0;
		if (i != 0) i = fread(&summary_set, sizeof(summary_set), 1, fin);
		if (i != 0) offset += sizeof(summary_set);
		summarySampleslevelHeader sh;
		while (i != 0) {
			i = fread(&sh, sizeof(sh), 1, fin);
			if (i != 0) {
				auto iter = eventtoperiods.find(sh.event_id);
				if (iter != eventtoperiods.end()) {
					summary_period k;
					k.summary_id = sh.summary_id;
					k.fileindex = file_id;
					for (auto period : iter->second) {
						k.period_no = period;
						summaryfileperiod_to_offset[k].push_back(offset);
					}
				}
				offset += sizeof(sh);
			}
			while (i != 0) {
				sampleslevelRec sr;
				i = fread(&sr, sizeof(sr), 1, fin);
				if (i != 0) offset += sizeof(sr);
				if (i == 0) break;
				if (sr.sidx == 0) break;
			}
		}

		fclose(fin);
	}